

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::iterate(ShaderAtomicOpCase *this)

{
  GLuint program;
  deUint32 valNdx;
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLenum GVar4;
  uint uVar5;
  undefined4 extraout_var;
  pointer puVar6;
  void *pvVar7;
  TestError *pTVar8;
  char *description;
  uint uVar9;
  allocator_type local_189;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  Buffer inoutBuffer;
  InterfaceVariableInfo groupVarInfo;
  InterfaceVariableInfo inVarInfo;
  InterfaceBlockInfo blockInfo;
  InterfaceVariableInfo outVarInfo;
  Functions *gl;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  program = (this->m_program->m_program).m_program;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&inoutBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  GVar2 = (*gl->getProgramResourceIndex)(program,0x92e6,"InOut");
  glu::getProgramInterfaceBlockInfo(&blockInfo,gl,program,0x92e6,GVar2);
  GVar2 = (*gl->getProgramResourceIndex)(program,0x92e5,"InOut.inputValues[0]");
  glu::getProgramInterfaceVariableInfo(&inVarInfo,gl,program,0x92e5,GVar2);
  GVar2 = (*gl->getProgramResourceIndex)(program,0x92e5,"InOut.outputValues[0]");
  glu::getProgramInterfaceVariableInfo(&outVarInfo,gl,program,0x92e5,GVar2);
  GVar2 = (*gl->getProgramResourceIndex)(program,0x92e5,"InOut.groupValues[0]");
  glu::getProgramInterfaceVariableInfo(&groupVarInfo,gl,program,0x92e5,GVar2);
  dVar3 = (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[2] *
          (this->m_numWorkGroups).m_data[0];
  uVar9 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
          (this->m_workGroupSize).m_data[0] * dVar3;
  if (((inVarInfo.arraySize != uVar9) || (outVarInfo.arraySize != uVar9)) ||
     (groupVarInfo.arraySize != dVar3)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,(char *)0x0,
               "inVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
               ,0xcf);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*gl->useProgram)(program);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bufData,(ulong)blockInfo.dataSize,&local_189);
  for (puVar6 = bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 != bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    *puVar6 = '\0';
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)uVar9,(ulong)(uint)inVarInfo.arrayStride,
             bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + inVarInfo.offset);
  if (this->m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    for (uVar5 = 0;
        uVar5 < (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[2] *
                (this->m_numWorkGroups).m_data[0]; uVar5 = uVar5 + 1) {
      *(deUint32 *)
       (bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start +
       (ulong)(groupVarInfo.arrayStride * uVar5) + (ulong)groupVarInfo.offset) =
           this->m_initialValue;
    }
  }
  (*gl->bindBuffer)(0x90d2,inoutBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)blockInfo.dataSize,
                    bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,0x88e5);
  (*gl->bindBufferBase)(0x90d2,0,inoutBuffer.super_ObjectWrapper.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0xe3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  (*gl->dispatchCompute)
            ((this->m_numWorkGroups).m_data[0],(this->m_numWorkGroups).m_data[1],
             (this->m_numWorkGroups).m_data[2]);
  pvVar7 = (*gl->mapBufferRange)(0x90d2,0,(ulong)blockInfo.dataSize,1);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0xed);
  if (pvVar7 != (void *)0x0) {
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,(ulong)uVar9,(ulong)(uint)inVarInfo.arrayStride,
                       (ulong)inVarInfo.offset + (long)pvVar7,(ulong)(uint)outVarInfo.arrayStride,
                       (ulong)outVarInfo.offset + (long)pvVar7,(ulong)(uint)groupVarInfo.arrayStride
                       ,(ulong)groupVarInfo.offset + (long)pvVar7);
    (*gl->unmapBuffer)(0x90d2);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                    ,0xf6);
    description = "Comparison failed";
    if ((byte)iVar1 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar1 ^ 1),description);
    std::__cxx11::string::~string((string *)&groupVarInfo);
    std::__cxx11::string::~string((string *)&outVarInfo);
    std::__cxx11::string::~string((string *)&inVarInfo);
    glu::InterfaceBlockInfo::~InterfaceBlockInfo(&blockInfo);
    glu::ObjectWrapper::~ObjectWrapper(&inoutBuffer.super_ObjectWrapper);
    return STOP;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"resPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
             ,0xee);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicOpCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				inVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.inputValues[0]");
	const InterfaceVariableInfo	inVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, inVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(inVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// Setup buffer.
	{
		vector<deUint8> bufData(blockInfo.dataSize);
		std::fill(bufData.begin(), bufData.end(), 0);

		getInputs((int)numValues, (int)inVarInfo.arrayStride, &bufData[0] + inVarInfo.offset);

		if (m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE)
		{
			for (deUint32 valNdx = 0; valNdx < product(m_numWorkGroups); valNdx++)
				*(deUint32*)(&bufData[0] + groupVarInfo.offset + groupVarInfo.arrayStride*valNdx) = m_initialValue;
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		bool			isOk		= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		isOk = verify((int)numValues,
					  (int)inVarInfo.arrayStride, (const deUint8*)resPtr + inVarInfo.offset,
					  (int)outVarInfo.arrayStride, (const deUint8*)resPtr + outVarInfo.offset,
					  (int)groupVarInfo.arrayStride, (const deUint8*)resPtr + groupVarInfo.offset);

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}